

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-wizard.c
# Opt level: O3

void do_cmd_wiz_collect_obj_mon_stats(command *cmd)

{
  _Bool _Var1;
  wchar_t wVar2;
  wchar_t simtype;
  wchar_t nsim;
  char s [80];
  wchar_t local_70;
  wchar_t local_6c;
  char local_68 [88];
  
  _Var1 = stats_are_enabled();
  if (_Var1) {
    wVar2 = cmd_get_arg_number((command_conflict *)cmd,"quantity",&local_6c);
    if (wVar2 != L'\0') {
      strnfmt(local_68,0x50,"%d",(ulong)(uint)do_cmd_wiz_collect_obj_mon_stats::default_nsim);
      _Var1 = get_string("Number of simulations: ",local_68,0x50);
      if (!_Var1) {
        return;
      }
      _Var1 = get_int_from_string(local_68,&local_6c);
      if (local_6c < L'\x01' || !_Var1) {
        return;
      }
      cmd_set_arg_number((command_conflict *)cmd,"quantity",local_6c);
    }
    do_cmd_wiz_collect_obj_mon_stats::default_nsim = local_6c;
    wVar2 = cmd_get_arg_choice((command_conflict *)cmd,"choice",&local_70);
    if (wVar2 != L'\0') {
      strnfmt(local_68,0x50,"%d",(ulong)(uint)do_cmd_wiz_collect_obj_mon_stats::default_simtype);
      _Var1 = get_string("Type of Sim: Diving (1) or Clearing (2) ",local_68,0x50);
      if (!_Var1) {
        return;
      }
      _Var1 = get_int_from_string(local_68,&local_70);
      if (1 < (uint)(local_70 + L'\xffffffff') || !_Var1) {
        return;
      }
      wVar2 = L'\x01';
      if ((local_70 == L'\x02') &&
         (_Var1 = get_check("Regen randarts (warning SLOW)? "), wVar2 = local_70, _Var1)) {
        local_70 = L'\x03';
        wVar2 = L'\x03';
      }
      cmd_set_arg_choice((command_conflict *)cmd,"choice",wVar2);
    }
    do_cmd_wiz_collect_obj_mon_stats::default_simtype = (uint)(local_70 != L'\x01') + L'\x01';
    stats_collect(local_6c,local_70);
  }
  return;
}

Assistant:

void do_cmd_wiz_collect_obj_mon_stats(struct command *cmd)
{
	/* Record last-used values to be the default in next run. */
	static int default_nsim = 50;
	static int default_simtype = 1;
	int nsim, simtype;
	char s[80];

	if (!stats_are_enabled()) return;

	if (cmd_get_arg_number(cmd, "quantity", &nsim) != CMD_OK) {
		/* Set default. */
		strnfmt(s, sizeof(s), "%d", default_nsim);

		if (!get_string("Number of simulations: ", s, sizeof(s))) return;
		if (!get_int_from_string(s, &nsim) || nsim < 1) return;
		cmd_set_arg_number(cmd, "quantity", nsim);
	}
	default_nsim = nsim;

	if (cmd_get_arg_choice(cmd, "choice", &simtype) != CMD_OK) {
		/* Set default. */
		strnfmt(s, sizeof(s), "%d", default_simtype);

		if (!get_string("Type of Sim: Diving (1) or Clearing (2) ",
			s, sizeof(s))) return;
		if (!get_int_from_string(s, &simtype) || simtype < 1 ||
			simtype > 2) return;
		if (simtype == 2) {
			if (get_check("Regen randarts (warning SLOW)? ")) {
				simtype = 3;
			}
		}
		cmd_set_arg_choice(cmd, "choice", simtype);
	}
	default_simtype = (simtype == 1) ? 1 : 2;

	stats_collect(nsim, simtype);
}